

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::StartObject(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
              *this)

{
  bool bVar1;
  SchemaType *this_00;
  Context *context_00;
  char *pcVar2;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *pSVar3;
  bool local_61;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *local_60;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *local_50;
  uint local_28;
  uint local_24;
  SizeType i__1;
  SizeType i_;
  Context *context;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  if ((this->valid_ & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = BeginValue(this);
    if ((bVar1) || (bVar1 = GetContinueOnErrors(this), bVar1)) {
      this_00 = CurrentSchema(this);
      context_00 = CurrentContext(this);
      bVar1 = internal::
              Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
              ::StartObject(this_00,context_00);
      if ((bVar1) || (bVar1 = GetContinueOnErrors(this), bVar1)) {
        for (_i__1 = internal::Stack<rapidjson::CrtAllocator>::
                     Bottom<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                               (&this->schemaStack_);
            pSVar3 = internal::Stack<rapidjson::CrtAllocator>::
                     End<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                               (&this->schemaStack_), _i__1 != pSVar3; _i__1 = _i__1 + 1) {
          if (_i__1->hasher != (void *)0x0) {
            internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::StartObject
                      ((Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)_i__1->hasher);
          }
          if (_i__1->validators != (ISchemaValidator **)0x0) {
            for (local_24 = 0; local_24 < _i__1->validatorCount; local_24 = local_24 + 1) {
              if (_i__1->validators[local_24] == (ISchemaValidator *)0x0) {
                local_50 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                            *)0x0;
              }
              else {
                local_50 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                            *)(_i__1->validators[local_24] + -1);
              }
              StartObject(local_50);
            }
          }
          if (_i__1->patternPropertiesValidators != (ISchemaValidator **)0x0) {
            for (local_28 = 0; local_28 < _i__1->patternPropertiesValidatorCount;
                local_28 = local_28 + 1) {
              if (_i__1->patternPropertiesValidators[local_28] == (ISchemaValidator *)0x0) {
                local_60 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                            *)0x0;
              }
              else {
                local_60 = (GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                            *)(_i__1->patternPropertiesValidators[local_28] + -1);
              }
              StartObject(local_60);
            }
          }
        }
        local_61 = true;
        if (this->outputHandler_ != (BaseReaderHandler<rapidjson::UTF8<char>,_void> *)0x0) {
          local_61 = BaseReaderHandler<rapidjson::UTF8<char>,_void>::StartObject
                               (this->outputHandler_);
        }
        this->valid_ = local_61;
        return (bool)(this->valid_ & 1);
      }
    }
    pcVar2 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->documentStack_,1);
    *pcVar2 = '\0';
    internal::Stack<rapidjson::CrtAllocator>::Pop<char>(&this->documentStack_,1);
    this->valid_ = false;
    this_local._7_1_ = (bool)(this->valid_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool StartObject() {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::StartObject");
        RAPIDJSON_SCHEMA_HANDLE_BEGIN_(StartObject, (CurrentContext()));
        RAPIDJSON_SCHEMA_HANDLE_PARALLEL_(StartObject, ());
        valid_ = !outputHandler_ || outputHandler_->StartObject();
        return valid_;
    }